

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O0

int SUNLinSolSpace(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  long *leniwLS_local;
  long *lenrwLS_local;
  SUNLinearSolver S_local;
  
  if (S->ops->space == (_func_int_SUNLinearSolver_long_ptr_long_ptr *)0x0) {
    *lenrwLS = 0;
    *leniwLS = 0;
    S_local._4_4_ = 0;
  }
  else {
    S_local._4_4_ = (*S->ops->space)(S,lenrwLS,leniwLS);
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolSpace(SUNLinearSolver S, long int *lenrwLS,
                   long int *leniwLS)
{
  if (S->ops->space)
    return ((int) S->ops->space(S, lenrwLS, leniwLS));
  else {
    *lenrwLS = 0;
    *leniwLS = 0;
    return SUNLS_SUCCESS;
  }
}